

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_executor.hpp
# Opt level: O2

void duckdb::GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_>::AssignResult
               (Vector *result,idx_t i,
               GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_> *value)

{
  data_ptr_t pdVar1;
  Vector *pVVar2;
  idx_t iVar3;
  reference pvVar4;
  size_type __n;
  size_type sVar5;
  
  pVVar2 = ListVector::GetEntry(result);
  iVar3 = ListVector::GetListSize(result);
  sVar5 = (long)(value->values).
                super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                .
                super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(value->values).
                super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                .
                super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  ListVector::Reserve(result,iVar3 + sVar5);
  pdVar1 = result->data;
  *(idx_t *)(pdVar1 + i * 0x10) = iVar3;
  *(size_type *)(pdVar1 + i * 0x10 + 8) = sVar5;
  for (__n = 0; sVar5 != __n; __n = __n + 1) {
    pvVar4 = vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::get<true>(&value->values,__n)
    ;
    *(int64_t *)(pVVar2->data + __n * 8 + iVar3 * 8) = (pvVar4->val).value;
  }
  ListVector::SetListSize(result,iVar3 + sVar5);
  return;
}

Assistant:

static void AssignResult(Vector &result, idx_t i, GenericListType<CHILD_TYPE> value) {
		auto &child = ListVector::GetEntry(result);
		auto current_size = ListVector::GetListSize(result);

		// reserve space in the child element
		auto list_size = value.values.size();
		ListVector::Reserve(result, current_size + list_size);

		auto list_entries = FlatVector::GetData<list_entry_t>(result);
		list_entries[i].offset = current_size;
		list_entries[i].length = list_size;

		for (idx_t child_idx = 0; child_idx < list_size; child_idx++) {
			CHILD_TYPE::AssignResult(child, current_size + child_idx, value.values[child_idx]);
		}
		ListVector::SetListSize(result, current_size + list_size);
	}